

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::EnumDescriptor>
          (DescriptorBuilder *this,Edition edition,Proto *proto,EnumDescriptor *descriptor,
          OptionsType *options,FlatAllocator *alloc,ErrorLocation error_location,bool force_merge)

{
  Tables *pTVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  FeatureSet **ppFVar3;
  FeatureSet *pFVar4;
  size_t sVar5;
  FeatureSet *pFVar6;
  string_view element_name;
  string_view element_name_00;
  StatusOr<google::protobuf::FeatureSet> *local_d0;
  StatusOr<google::protobuf::FeatureSet> merged;
  FeatureSet base_features;
  
  if (descriptor->containing_type_ == (Descriptor *)0x0) {
    ppFVar3 = &descriptor->file_->merged_features_;
  }
  else {
    ppFVar3 = &descriptor->containing_type_->merged_features_;
  }
  pFVar6 = *ppFVar3;
  descriptor->proto_features_ = (FeatureSet *)&_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)&_FeatureSet_default_instance_;
  if ((this->feature_resolver_).
      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged != false) {
    bVar2 = EnumOptions::has_features(options);
    if (bVar2) {
      pTVar1 = this->tables_;
      pFVar4 = EnumOptions::mutable_features(options);
      pFVar4 = DescriptorPool::Tables::InternFeatureSet(pTVar1,pFVar4);
      descriptor->proto_features_ = pFVar4;
      EnumOptions::clear_features(options);
    }
    FeatureSet::FeatureSet(&base_features,descriptor->proto_features_);
    if (((int)edition < 1000) &&
       (descriptor->proto_features_ != (FeatureSet *)&_FeatureSet_default_instance_)) {
      element_name._M_str = (descriptor->all_names_->_M_dataplus)._M_p;
      element_name._M_len = descriptor->all_names_->_M_string_length;
      AddError(this,element_name,&proto->super_Message,error_location,
               "Features are only valid under editions.");
    }
    sVar5 = FeatureSet::ByteSizeLong(&base_features);
    if (sVar5 == 0 && !force_merge) {
      descriptor->merged_features_ = pFVar6;
    }
    else {
      FeatureResolver::MergeFeatures
                (&merged,(FeatureResolver *)&this->feature_resolver_,pFVar6,&base_features);
      if (merged.super_StatusOrData<google::protobuf::FeatureSet>.field_0 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1) {
        pTVar1 = this->tables_;
        absl::lts_20240722::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::EnsureOk
                  (&merged.super_StatusOrData<google::protobuf::FeatureSet>);
        pFVar6 = DescriptorPool::Tables::InternFeatureSet
                           (pTVar1,&merged.super_StatusOrData<google::protobuf::FeatureSet>.field_1.
                                    data_);
        descriptor->merged_features_ = pFVar6;
      }
      else {
        make_error.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::EnumDescriptor>(google::protobuf::Edition,google::protobuf::EnumDescriptor::Proto_const&,google::protobuf::EnumDescriptor*,google::protobuf::EnumDescriptor::OptionsType*,google::protobuf::internal::FlatAllocator&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,bool)::_lambda()_1_,std::__cxx11::string>
        ;
        make_error.ptr_.obj = &local_d0;
        element_name_00._M_str = (descriptor->all_names_->_M_dataplus)._M_p;
        element_name_00._M_len = descriptor->all_names_->_M_string_length;
        local_d0 = &merged;
        AddError(this,element_name_00,&proto->super_Message,error_location,make_error);
      }
      absl::lts_20240722::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
      ~StatusOrData(&merged.super_StatusOrData<google::protobuf::FeatureSet>);
    }
    FeatureSet::~FeatureSet(&base_features);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&merged,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
             ,0x15a6,0x1d,"feature_resolver_.has_value()");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&merged);
}

Assistant:

void DescriptorBuilder::ResolveFeaturesImpl(
    Edition edition, const typename DescriptorT::Proto& proto,
    DescriptorT* descriptor, typename DescriptorT::OptionsType* options,
    internal::FlatAllocator& alloc,
    DescriptorPool::ErrorCollector::ErrorLocation error_location,
    bool force_merge) {
  const FeatureSet& parent_features = GetParentFeatures(descriptor);
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();

  ABSL_CHECK(feature_resolver_.has_value());

  if (options->has_features()) {
    // Remove the features from the child's options proto to avoid leaking
    // internal details.
    descriptor->proto_features_ =
        tables_->InternFeatureSet(std::move(*options->mutable_features()));
    options->clear_features();
  }

  FeatureSet base_features = *descriptor->proto_features_;

  // Handle feature inference from proto2/proto3.
  if (IsLegacyEdition(edition)) {
    if (descriptor->proto_features_ != &FeatureSet::default_instance()) {
      AddError(descriptor->name(), proto, error_location,
               "Features are only valid under editions.");
    }
  }
  InferLegacyProtoFeatures(proto, *options, edition, base_features);

  if (base_features.ByteSizeLong() == 0 && !force_merge) {
    // Nothing to merge, and we aren't forcing it.
    descriptor->merged_features_ = &parent_features;
    return;
  }

  // Calculate the merged features for this target.
  absl::StatusOr<FeatureSet> merged =
      feature_resolver_->MergeFeatures(parent_features, base_features);
  if (!merged.ok()) {
    AddError(descriptor->name(), proto, error_location,
             [&] { return std::string(merged.status().message()); });
    return;
  }

  descriptor->merged_features_ = tables_->InternFeatureSet(*std::move(merged));
}